

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField
          (FieldGenerator *this,Printer *printer)

{
  undefined1 *puVar1;
  byte bVar2;
  FieldDescriptor *pFVar3;
  Context *pCVar4;
  pointer pcVar5;
  bool bVar6;
  ClassNameResolver *this_00;
  EnumDescriptor *pEVar7;
  MessageLite *pMVar8;
  Nonnull<const_char_*> failure_msg;
  long lVar9;
  string_view text;
  string_view text_00;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  JvmNameContext name_ctx;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  undefined8 uStack_3a0;
  anon_class_1_0_00000001 local_391;
  Printer *local_390;
  undefined1 *local_388;
  undefined1 local_380 [24];
  char *local_368;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_360;
  char local_358;
  undefined7 uStack_357;
  undefined8 uStack_350;
  char *local_348;
  tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_340;
  char local_338;
  undefined7 uStack_337;
  undefined1 auStack_330 [8];
  string local_328;
  undefined1 *local_308;
  undefined8 local_300;
  undefined1 local_2f8;
  undefined7 uStack_2f7;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [56];
  code *local_2b0;
  byte local_2a8;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  bool local_280;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_278;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  string *local_210;
  undefined8 uStack_208;
  code *local_200;
  code *local_1f8;
  undefined1 local_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8;
  undefined1 local_180;
  string local_178;
  string local_158;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined2 local_f0;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined2 local_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined2 local_50;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  
  local_390 = printer;
  this_00 = java::Context::GetNameResolver(this->context_);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"kt_type","");
  pEVar7 = FieldDescriptor::enum_type(this->descriptor_);
  java::ClassNameResolver::GetClassName_abi_cxx11_(&local_158,this_00,pEVar7,true);
  java::EscapeKotlinKeywords(&local_328,&local_158);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_2e8,&local_178,&local_328);
  vars.len_ = 1;
  vars.ptr_ = (pointer)local_2e8;
  io::Printer::WithDefs(&local_48,local_390,vars,false);
  if (local_278._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_278);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p != &local_290) {
    operator_delete(local_2a0._M_p,
                    CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_2a8]._M_data)
            (&local_391,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_2e8 + 0x20));
  local_2a8 = 0xff;
  if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT71(local_328.field_2._M_allocated_capacity._1_7_,
                             local_328.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  pFVar3 = this->descriptor_;
  bVar2 = pFVar3->field_0x1;
  bVar6 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar6) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar6,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    if ((pFVar3->field_0x1 & 0x20) == 0) {
      pCVar4 = this->context_;
      local_328._M_dataplus._M_p = &(pCVar4->options_).generate_immutable_code;
      local_328._M_string_length = (size_type)local_390;
      local_328.field_2._M_local_buf[0] = this->lite_;
      pFVar3 = this->descriptor_;
      local_98[4] = (pCVar4->options_).opensource_runtime;
      local_98[5] = (pCVar4->options_).annotate_code;
      local_98[0] = (pCVar4->options_).generate_immutable_code;
      local_98[1] = (pCVar4->options_).generate_mutable_code;
      local_98[2] = (pCVar4->options_).generate_shared_code;
      local_98[3] = (pCVar4->options_).enforce_lite;
      pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
      local_90._M_p = (pointer)&local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar5,
                 pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
      pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar5,
                 pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
      local_50._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
      local_50._1_1_ = (pCVar4->options_).jvm_dsl;
      java::WriteFieldDocComment(local_390,pFVar3,(Options *)local_98,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      local_348 = &local_338;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"jvm_name_get","");
      local_2a0._M_p = (pointer)&local_290;
      if (local_348 == &local_338) {
        local_2e8._24_8_ = auStack_330;
        local_2e8._0_8_ = local_2e8 + 0x10;
      }
      else {
        local_2e8._0_8_ = local_348;
      }
      local_2e8._8_8_ =
           local_340.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
      local_340.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )(_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        )0x0;
      local_338 = '\0';
      local_2b0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_2e8._32_8_ = &local_328;
      local_2e8._40_8_ = 0;
      local_2e8._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_2a8 = '\x01';
      local_298 = 0;
      local_290._M_local_buf[0] = '\0';
      local_280 = false;
      local_348 = &local_338;
      std::__cxx11::string::_M_replace((ulong)&local_2a0,0,(char *)0x0,0x53a374);
      local_278._M_engaged = false;
      local_308 = &local_2f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"jvm_name_set","");
      local_230 = local_220;
      if (local_308 == &local_2f8) {
        uStack_218 = uStack_2f0;
      }
      else {
        local_230 = local_308;
      }
      local_228 = local_300;
      local_300 = 0;
      local_2f8 = 0;
      local_1f8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_210 = &local_328;
      uStack_208 = 0;
      local_200 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_1f0 = 1;
      local_1e8 = local_1d8;
      local_1e0 = 0;
      local_1d8[0] = 0;
      local_1c8 = 0;
      local_308 = &local_2f8;
      std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,0x53a374);
      local_180 = 0;
      io::Printer::Emit(local_390,local_2e8,2,0xc5);
      lVar9 = 0x170;
      do {
        if (*(char *)((long)&uStack_2f0 + lVar9) == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (auStack_330 + lVar9));
        }
        if ((long *)((long)&local_348 + lVar9) != *(long **)(&local_358 + lVar9)) {
          operator_delete(*(long **)(&local_358 + lVar9),*(long *)((long)&local_348 + lVar9) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[*(byte *)((long)&local_360._M_head_impl + lVar9)]._M_data)
                  (&local_391,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_380 + lVar9));
        *(undefined1 *)((long)&local_360._M_head_impl + lVar9) = 0xff;
        if ((long *)((long)&local_390 + lVar9) != *(long **)((long)&uStack_3a0 + lVar9)) {
          operator_delete(*(long **)((long)&uStack_3a0 + lVar9),
                          *(long *)((long)&local_390 + lVar9) + 1);
        }
        lVar9 = lVar9 + -0xb8;
      } while (lVar9 != 0);
      if (local_308 != &local_2f8) {
        operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
      }
      pFVar3 = this->descriptor_;
      pMVar8 = protobuf::internal::ExtensionSet::GetMessage
                         (&(pFVar3->merged_features_->field_0)._impl_._extensions_,pb::java,
                          (MessageLite *)PTR__JavaFeatures_default_instance__00855a30);
      if (*(char *)((long)&pMVar8[1]._internal_metadata_.ptr_ + 4) == '\0') {
        pEVar7 = FieldDescriptor::enum_type(pFVar3);
        if (pEVar7 != (EnumDescriptor *)0x0) {
          pEVar7 = FieldDescriptor::enum_type(pFVar3);
          bVar6 = EnumDescriptor::is_closed(pEVar7);
          if (!bVar6) {
            local_368 = &local_358;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"jvm_name_get","");
            local_2e8._0_8_ = local_2e8 + 0x10;
            local_2a0._M_p = (pointer)&local_290;
            if (local_368 == &local_358) {
              local_2e8._24_8_ = uStack_350;
            }
            else {
              local_2e8._0_8_ = local_368;
            }
            local_2e8._8_8_ = local_360._M_head_impl;
            local_360._M_head_impl = (LogMessageData *)0x0;
            local_358 = '\0';
            local_2b0 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                        ::_M_invoke;
            local_2e8._32_8_ = &local_328;
            local_2e8._40_8_ = 0;
            local_2e8._48_8_ =
                 std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
            local_2a8 = '\x01';
            local_298 = 0;
            local_290._M_local_buf[0] = '\0';
            local_280 = false;
            local_368 = &local_358;
            std::__cxx11::string::_M_replace((ulong)&local_2a0,0,(char *)0x0,0x53a374);
            local_278._M_engaged = false;
            puVar1 = local_380 + 8;
            local_388 = puVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"jvm_name_set","");
            local_230 = local_220;
            if (local_388 == puVar1) {
              uStack_218 = local_380._16_8_;
            }
            else {
              local_230 = local_388;
            }
            local_228 = local_380._0_8_;
            local_380._0_8_ = 0;
            local_380[8] = 0;
            local_1f8 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                        ::_M_invoke;
            local_210 = &local_328;
            uStack_208 = 0;
            local_200 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                        ::_M_manager;
            local_1f0 = 1;
            local_1e8 = local_1d8;
            local_1e0 = 0;
            local_1d8[0] = 0;
            local_1c8 = 0;
            local_388 = puVar1;
            std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,0x53a374);
            local_180 = 0;
            io::Printer::Emit(local_390,local_2e8,2,0xdd);
            lVar9 = 0x170;
            do {
              if (*(char *)((long)&uStack_2f0 + lVar9) == '\x01') {
                std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            *)(auStack_330 + lVar9));
              }
              if ((long *)((long)&local_348 + lVar9) != *(long **)(&local_358 + lVar9)) {
                operator_delete(*(long **)(&local_358 + lVar9),
                                *(long *)((long)&local_348 + lVar9) + 1);
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                ::_S_vtable._M_arr[*(byte *)((long)&local_360._M_head_impl + lVar9)]._M_data)
                        (&local_391,
                         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          *)(local_380 + lVar9));
              *(undefined1 *)((long)&local_360._M_head_impl + lVar9) = 0xff;
              if ((long *)((long)&local_390 + lVar9) != *(long **)((long)&uStack_3a0 + lVar9)) {
                operator_delete(*(long **)((long)&uStack_3a0 + lVar9),
                                *(long *)((long)&local_390 + lVar9) + 1);
              }
              lVar9 = lVar9 + -0xb8;
            } while (lVar9 != 0);
            if (local_388 != local_380 + 8) {
              operator_delete(local_388,CONCAT71(local_380._9_7_,local_380[8]) + 1);
            }
            if (local_368 != &local_358) {
              operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
            }
          }
        }
      }
      pFVar3 = this->descriptor_;
      pCVar4 = this->context_;
      local_e8[4] = (pCVar4->options_).opensource_runtime;
      local_e8[5] = (pCVar4->options_).annotate_code;
      local_e8[0] = (pCVar4->options_).generate_immutable_code;
      local_e8[1] = (pCVar4->options_).generate_mutable_code;
      local_e8[2] = (pCVar4->options_).generate_shared_code;
      local_e8[3] = (pCVar4->options_).enforce_lite;
      pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
      local_e0._M_p = (pointer)&local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar5,
                 pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
      pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
      local_c0._M_p = (pointer)&local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar5,
                 pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
      local_a0._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
      local_a0._1_1_ = (pCVar4->options_).jvm_dsl;
      java::WriteFieldAccessorDocComment
                (local_390,pFVar3,CLEARER,(Options *)local_e8,false,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
      }
      text._M_str = 
      "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
      ;
      text._M_len = 0x65;
      io::Printer::Print<>(local_390,text);
      bVar6 = FieldDescriptor::has_presence(this->descriptor_);
      if (bVar6) {
        pFVar3 = this->descriptor_;
        pCVar4 = this->context_;
        local_138[4] = (pCVar4->options_).opensource_runtime;
        local_138[5] = (pCVar4->options_).annotate_code;
        local_138[0] = (pCVar4->options_).generate_immutable_code;
        local_138[1] = (pCVar4->options_).generate_mutable_code;
        local_138[2] = (pCVar4->options_).generate_shared_code;
        local_138[3] = (pCVar4->options_).enforce_lite;
        pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
        local_130._M_p = (pointer)&local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar5,
                   pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
        pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
        local_110._M_p = (pointer)&local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar5,
                   pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
        local_f0._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
        local_f0._1_1_ = (pCVar4->options_).jvm_dsl;
        java::WriteFieldAccessorDocComment
                  (local_390,pFVar3,HAZZER,(Options *)local_138,false,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        text_00._M_str =
             "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
        ;
        text_00._M_len = 0x78;
        io::Printer::Print<>(local_390,text_00);
      }
    }
    else {
      GenerateRepeatedEnumField(this,local_390);
    }
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_48);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_2e8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_2e8);
}

Assistant:

void FieldGenerator::GenerateEnumField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  auto cleanup = printer->WithVars(
      {{"kt_type",
        java::EscapeKotlinKeywords(
            name_resolver->GetImmutableClassName(descriptor_->enum_type()))}});

  if (descriptor_->is_repeated()) {
    GenerateRepeatedEnumField(printer);
    return;
  }

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: $kt_type$\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  if (java::SupportUnknownEnumValue(descriptor_)) {
    printer->Emit(
        {
            {"jvm_name_get",
             [&] { JvmName("${$get$kt_capitalized_name$Value$}$", name_ctx); }},
            {"jvm_name_set",
             [&] { JvmName("${$set$kt_capitalized_name$Value$}$", name_ctx); }},
        },
        "$kt_deprecation$public var $kt_name$Value: kotlin.Int\n"
        "  $jvm_name_get$"
        "  get() = $kt_dsl_builder$.${$$kt_property_name$Value$}$\n"
        "  $jvm_name_set$"
        "  set(value) {\n"
        "    $kt_dsl_builder$.${$$kt_property_name$Value$}$ = value\n"
        "  }\n");
  }

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(),
                               /* builder */ false, /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(),
                                 /* builder */ false, /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}